

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall
DSBarInfo::DrawString
          (DSBarInfo *this,FFont *font,char *cstring,SBarInfoCoordinate x,SBarInfoCoordinate y,
          int xOffset,int yOffset,double Alpha,bool fullScreenOffsets,EColorRange translation,
          int spacing,bool drawshadow,int shadowX,int shadowY)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  double dVar4;
  int iVar5;
  EColorRange range;
  FRemapTable *pFVar6;
  undefined4 extraout_var;
  SBarInfo *pSVar7;
  double dVar8;
  double rx;
  double ry;
  BYTE *str;
  double local_a0;
  double rw;
  EColorRange local_8c;
  double rh;
  int local_7c;
  double yScale;
  double xScale;
  double local_68;
  double local_60;
  double ay;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  FTexture *img;
  
  local_a0 = (double)((int)x + spacing * 2 >> 1);
  local_68 = (double)((int)y >> 1);
  xScale = 1.0;
  yScale = 1.0;
  local_8c = translation;
  if (translation == CR_BRICK) {
    local_8c = NumTextColors;
  }
  str = (BYTE *)cstring;
  local_60 = local_a0;
  ay = local_68;
  local_50 = Alpha;
  pFVar6 = FFont::GetColorTranslation(font,translation);
  if (fullScreenOffsets) {
    if (hud_scale.Value == true) {
      xScale = (double)this->script->cleanX;
      yScale = (double)this->script->cleanY;
    }
    rx = local_60;
    ry = local_68;
    adjustRelCenter((bool)(x._0_1_ & 1),(bool)(y._0_1_ & 1),&rx,&ry,&local_a0,&ay,&xScale,&yScale);
  }
  local_60 = (double)xOffset;
  local_68 = (double)yOffset;
  local_8c = local_8c + CR_UNDEFINED;
  local_40 = (double)shadowX;
  local_38 = local_50 * 0.40625;
  local_48 = (double)shadowY;
  do {
    for (; bVar1 = *str, bVar1 == 0x20; str = str + 1) {
      if (this->script->spacingCharacter == '\0') {
        local_a0 = (double)font->SpaceWidth + local_a0;
      }
      else {
        iVar5 = (*font->_vptr_FFont[3])(font);
        local_a0 = (double)iVar5 + local_a0;
      }
LAB_004b6376:
    }
    if (bVar1 == 0) {
      return;
    }
    if (bVar1 != 0x1c) {
      bVar2 = this->script->spacingCharacter;
      if (bVar2 != 0) {
        bVar1 = bVar2;
      }
      local_7c = (*font->_vptr_FFont[3])(font,(ulong)bVar1,font->_vptr_FFont,(ulong)bVar1);
      iVar5 = (*font->_vptr_FFont[2])(font,(ulong)*str,&local_7c);
      img = (FTexture *)CONCAT44(extraout_var,iVar5);
      if (img != (FTexture *)0x0) {
        pSVar7 = this->script;
        if (pSVar7->spacingCharacter == '\0') {
          local_a0 = local_a0 + (double)(img->LeftOffset + 1);
        }
        rx = local_a0 + local_60;
        ry = ay + local_68;
        rw = (double)img->Width / (img->Scale).X;
        rh = (double)img->Height / (img->Scale).Y;
        if (pSVar7->spacingCharacter != '\0') {
          iVar5 = (*font->_vptr_FFont[3])(font);
          pSVar7 = this->script;
          if (pSVar7->spacingAlignment == ALIGN_RIGHT) {
            dVar8 = (double)iVar5 - rw;
          }
          else {
            if (pSVar7->spacingAlignment != ALIGN_CENTER) goto LAB_004b60fc;
            dVar8 = (double)iVar5 * 0.5 - rw * 0.5;
          }
          rx = dVar8 + rx;
        }
LAB_004b60fc:
        dVar8 = rx;
        if (fullScreenOffsets) {
          if (((vid_fps.Value == true) && (local_a0 < 0.0)) && (0.0 <= ay)) {
            ry = ry + 10.0;
          }
          dVar4 = ry;
          if (hud_scale.Value == true) {
            rx = rx * xScale;
            ry = ry * yScale;
            rw = xScale * rw;
            rh = yScale * rh;
          }
          if (dVar8 < 0.0) {
            rx = rx + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width;
          }
          if (dVar4 < 0.0) {
            iVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
LAB_004b626a:
            ry = ry + (double)iVar5;
          }
        }
        else {
          rx = (double)*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24 + rx;
          bVar3 = (this->super_DBaseStatusBar).Scaled;
          iVar5 = 200;
          if (bVar3 == true) {
            iVar5 = pSVar7->resH;
          }
          ry = (double)(((this->super_DBaseStatusBar).ST_Y - iVar5) + pSVar7->height) + ry;
          if (bVar3 == false) {
            iVar5 = 200 - pSVar7->resH;
            goto LAB_004b626a;
          }
          DCanvas::VirtualToRealCoords
                    ((DCanvas *)screen,&rx,&ry,&rw,&rh,(double)pSVar7->resW,(double)pSVar7->resH,
                     true,true);
        }
        if (drawshadow) {
          DCanvas::DrawTexture
                    ((DCanvas *)screen,img,rx + xScale * local_40,ry + yScale * local_48,0x400013af,
                     rw,rh,local_38,0x400013b0,0x4000138c,0x4000138d,0,0);
        }
        DCanvas::DrawTexture
                  ((DCanvas *)screen,img,rx,ry,0x400013af,rw,rh,0x400013b0,0x4000138e,pFVar6,
                   0x4000138c);
        if (this->script->spacingCharacter == '\0') {
          iVar5 = ~(int)img->LeftOffset + local_7c + spacing;
        }
        else {
          iVar5 = (*font->_vptr_FFont[3])(font);
          iVar5 = iVar5 + spacing;
        }
        local_a0 = (double)iVar5 + local_a0;
      }
      goto LAB_004b6376;
    }
    str = str + 1;
    range = V_ParseFontColor(&str,translation,local_8c);
    if (range != CR_UNDEFINED) {
      pFVar6 = FFont::GetColorTranslation(font,range);
    }
  } while( true );
}

Assistant:

void DrawString(FFont *font, const char* cstring, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, EColorRange translation, int spacing=0, bool drawshadow=false, int shadowX=2, int shadowY=2) const
	{
		x += spacing;
		double ax = *x;
		double ay = *y;

		double xScale = 1.0;
		double yScale = 1.0;

		const BYTE* str = (const BYTE*) cstring;
		const EColorRange boldTranslation = EColorRange(translation ? translation - 1 : NumTextColors - 1);
		FRemapTable *remap = font->GetColorTranslation(translation);

		if(fullScreenOffsets)
		{
			if(hud_scale)
			{
				xScale = script->cleanX;
				yScale = script->cleanY;
			}
			adjustRelCenter(x.RelCenter(), y.RelCenter(), *x, *y, ax, ay, xScale, yScale);
		}
		while(*str != '\0')
		{
			if(*str == ' ')
			{
				if(script->spacingCharacter == '\0')
					ax += font->GetSpaceWidth();
				else
					ax += font->GetCharWidth((unsigned char) script->spacingCharacter);
				str++;
				continue;
			}
			else if(*str == TEXTCOLOR_ESCAPE)
			{
				EColorRange newColor = V_ParseFontColor(++str, translation, boldTranslation);
				if(newColor != CR_UNDEFINED)
					remap = font->GetColorTranslation(newColor);
				continue;
			}

			int width;
			if(script->spacingCharacter == '\0') //No monospace?
				width = font->GetCharWidth((unsigned char) *str);
			else
				width = font->GetCharWidth((unsigned char) script->spacingCharacter);
			FTexture* character = font->GetChar((unsigned char) *str, &width);
			if(character == NULL) //missing character.
			{
				str++;
				continue;
			}
			if(script->spacingCharacter == '\0') //If we are monospaced lets use the offset
				ax += (character->LeftOffset+1); //ignore x offsets since we adapt to character size

			double rx, ry, rw, rh;
			rx = ax + xOffset;
			ry = ay + yOffset;
			rw = character->GetScaledWidthDouble();
			rh = character->GetScaledHeightDouble();

			if(script->spacingCharacter != '\0')
			{
				double spacingSize = font->GetCharWidth((unsigned char) script->spacingCharacter);
				switch(script->spacingAlignment)
				{
					default:
						break;
					case SBarInfo::ALIGN_CENTER:
						rx += (spacingSize/2)-(rw/2);
						break;
					case SBarInfo::ALIGN_RIGHT:
						rx += spacingSize-rw;
						break;
				}
			}

			if(!fullScreenOffsets)
			{
				rx += ST_X;
				ry += ST_Y - (Scaled ? script->resH : 200) + script->height;
				if(Scaled)
					screen->VirtualToRealCoords(rx, ry, rw, rh, script->resW, script->resH, true);
				else
				{
					ry += (200 - script->resH);
				}
			}
			else
			{
				if(vid_fps && ax < 0 && ay >= 0)
					ry += 10;

				bool xright = rx < 0;
				bool ybot = ry < 0;

				if(hud_scale)
				{
					rx *= xScale;
					ry *= yScale;
					rw *= xScale;
					rh *= yScale;
				}
				if(xright)
					rx = SCREENWIDTH + rx;
				if(ybot)
					ry = SCREENHEIGHT + ry;
			}
			if(drawshadow)
			{
				double salpha = (Alpha *HR_SHADOW);
				double srx = rx + (shadowX*xScale);
				double sry = ry + (shadowY*yScale);
				screen->DrawTexture(character, srx, sry,
					DTA_DestWidthF, rw,
					DTA_DestHeightF, rh,
					DTA_AlphaF, salpha,
					DTA_FillColor, 0,
					TAG_DONE);
			}
			screen->DrawTexture(character, rx, ry,
				DTA_DestWidthF, rw,
				DTA_DestHeightF, rh,
				DTA_Translation, remap,
				DTA_AlphaF, Alpha,
				TAG_DONE);
			if(script->spacingCharacter == '\0')
				ax += width + spacing - (character->LeftOffset+1);
			else //width gets changed at the call to GetChar()
				ax += font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing;
			str++;
		}
	}